

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::CompactRange(DBImpl *this,Slice *begin,Slice *end)

{
  long lVar1;
  Version *pVVar2;
  DBImpl *in_RDX;
  Slice *in_RDI;
  long in_FS_OFFSET;
  int level_1;
  int level;
  Version *base;
  int max_level_with_files;
  MutexLock l;
  VersionSet *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffffb4;
  Slice *in_stack_ffffffffffffffb8;
  Version *pVVar5;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 1;
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffff88,(Mutex *)0x188d168);
  pVVar2 = VersionSet::current(in_stack_ffffffffffffff88);
  pVVar5 = pVVar2;
  for (iVar4 = 1; iVar4 < 7; iVar4 = iVar4 + 1) {
    in_stack_ffffffffffffff97 =
         Version::OverlapInLevel
                   ((Version *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (int)((ulong)pVVar2 >> 0x20),in_RDI,
                    (Slice *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    iVar3 = iVar4;
    if (!(bool)in_stack_ffffffffffffff97) {
      iVar3 = iVar6;
    }
    iVar6 = iVar3;
  }
  MutexLock::~MutexLock((MutexLock *)in_stack_ffffffffffffff88);
  TEST_CompactMemTable(in_RDX);
  Status::~Status((Status *)in_stack_ffffffffffffff88);
  for (iVar3 = 0; iVar3 < iVar6; iVar3 = iVar3 + 1) {
    TEST_CompactRange((DBImpl *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                      (int)((ulong)pVVar5 >> 0x20),in_stack_ffffffffffffffb8,
                      (Slice *)CONCAT44(in_stack_ffffffffffffffb4,iVar4));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DBImpl::CompactRange(const Slice* begin, const Slice* end) {
  int max_level_with_files = 1;
  {
    MutexLock l(&mutex_);
    Version* base = versions_->current();
    for (int level = 1; level < config::kNumLevels; level++) {
      if (base->OverlapInLevel(level, begin, end)) {
        max_level_with_files = level;
      }
    }
  }
  TEST_CompactMemTable();  // TODO(sanjay): Skip if memtable does not overlap
  for (int level = 0; level < max_level_with_files; level++) {
    TEST_CompactRange(level, begin, end);
  }
}